

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad_filter.c
# Opt level: O0

int biquad_filter_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  biquad_filter_segment_data *data_00;
  biquad_filter_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  data_00 = (biquad_filter_segment_data *)segment->data;
  switch(field) {
  case 1:
    biquad_reset(&data_00->data);
    if ((*value & 1) == 0) {
      segment->mix = biquad_segment_mix;
    }
    else {
      segment->mix = biquad_filter_segment_mix_bypass;
    }
    break;
  case 2:
    if (*value == 0) {
      mixed_err(8);
      return 0;
    }
    data_00->samplerate = *value;
    biquad_reinit(data_00);
    break;
  default:
    mixed_err(7);
    return 0;
  case 0x20:
    if ((*value <= 0.0) || ((float)data_00->samplerate < *value)) {
      mixed_err(8);
      return 0;
    }
    data_00->frequency = *value;
    biquad_reinit(data_00);
    break;
  case 0x21:
    if ((*value == 0) || (8 < *value)) {
      mixed_err(8);
      return 0;
    }
    data_00->type = *value;
    biquad_reinit(data_00);
    break;
  case 0x22:
    data_00->gain = *value;
    biquad_reinit(data_00);
    break;
  case 0x23:
    data_00->Q = *value;
    biquad_reinit(data_00);
  }
  return 1;
}

Assistant:

int biquad_filter_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct biquad_filter_segment_data *data = (struct biquad_filter_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    biquad_reinit(data);
    break;
  case MIXED_FREQUENCY:
    if(*(float *)value <= 0 || data->samplerate < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->frequency = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_BIQUAD_FILTER:
    if(*(enum mixed_biquad_filter *)value < MIXED_LOWPASS ||
       MIXED_HIGHSHELF < *(enum mixed_biquad_filter *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->type = *(enum mixed_biquad_filter *)value;
    biquad_reinit(data);
    break;
  case MIXED_Q:
    data->Q = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_GAIN:
    data->gain = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_BYPASS:
    biquad_reset(&data->data);
    if(*(bool *)value){
      segment->mix = biquad_filter_segment_mix_bypass;
    }else{
      segment->mix = biquad_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}